

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCof.c
# Opt level: O0

int cuddCheckCube(DdManager *dd,DdNode *g)

{
  DdNode *pDVar1;
  DdNode *zero;
  DdNode *one;
  DdNode *g0;
  DdNode *g1;
  DdNode *g_local;
  DdManager *dd_local;
  
  if (g == dd->one) {
    dd_local._4_4_ = 1;
  }
  else if (*(int *)((ulong)g & 0xfffffffffffffffe) == 0x7fffffff) {
    dd_local._4_4_ = 0;
  }
  else {
    pDVar1 = (DdNode *)((ulong)dd->one ^ 1);
    g1 = g;
    g_local = &dd->sentinel;
    cuddGetBranches(g,&g0,&one);
    if (one == pDVar1) {
      dd_local._4_4_ = cuddCheckCube((DdManager *)g_local,g0);
    }
    else if (g0 == pDVar1) {
      dd_local._4_4_ = cuddCheckCube((DdManager *)g_local,one);
    }
    else {
      dd_local._4_4_ = 0;
    }
  }
  return dd_local._4_4_;
}

Assistant:

int
cuddCheckCube(
  DdManager * dd,
  DdNode * g)
{
    DdNode *g1,*g0,*one,*zero;
    
    one = DD_ONE(dd);
    if (g == one) return(1);
    if (Cudd_IsConstant(g)) return(0);

    zero = Cudd_Not(one);
    cuddGetBranches(g,&g1,&g0);

    if (g0 == zero) {
        return(cuddCheckCube(dd, g1));
    }
    if (g1 == zero) {
        return(cuddCheckCube(dd, g0));
    }
    return(0);

}